

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcRedirectFunction(uint sourceId,uint targetId)

{
  long lVar1;
  nullres nVar2;
  long lVar3;
  long lVar4;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar2 = '\0';
  }
  else {
    if (NULLC::currExec == 1) {
      ExecutorX86::UpdateFunctionPointer(NULLC::executorX86,sourceId,targetId);
    }
    if ((*(uint *)(NULLC::linker + 0x24c) <= sourceId) ||
       (*(uint *)(NULLC::linker + 0x24c) <= targetId)) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    lVar1 = *(long *)(NULLC::linker + 0x240);
    lVar3 = (ulong)sourceId * 0x94;
    lVar4 = (ulong)targetId * 0x94;
    *(undefined4 *)(lVar1 + 4 + lVar3) = *(undefined4 *)(lVar1 + 4 + lVar4);
    *(undefined4 *)(lVar1 + 8 + lVar3) = *(undefined4 *)(lVar1 + 8 + lVar4);
    *(undefined4 *)(lVar1 + 0xc + lVar3) = *(undefined4 *)(lVar1 + 0xc + lVar4);
    *(undefined8 *)(lVar1 + 0x1c + lVar3) = *(undefined8 *)(lVar1 + 0x1c + lVar4);
    *(undefined8 *)(lVar1 + 0x24 + lVar3) = *(undefined8 *)(lVar1 + 0x24 + lVar4);
    *(undefined8 *)(lVar1 + 0x2c + lVar3) = *(undefined8 *)(lVar1 + 0x2c + lVar4);
    nVar2 = '\x01';
  }
  return nVar2;
}

Assistant:

nullres nullcRedirectFunction(unsigned sourceId, unsigned targetId)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		executorX86->UpdateFunctionPointer(sourceId, targetId);
#endif

	ExternFuncInfo &destFunc = linker->exFunctions[sourceId];
	ExternFuncInfo &srcFunc = linker->exFunctions[targetId];

	destFunc.regVmAddress = srcFunc.regVmAddress;
	destFunc.regVmCodeSize = srcFunc.regVmCodeSize;
	destFunc.regVmRegisters = srcFunc.regVmRegisters;

	destFunc.funcPtrRaw = srcFunc.funcPtrRaw;
	destFunc.funcPtrWrapTarget = srcFunc.funcPtrWrapTarget;
	destFunc.funcPtrWrap = srcFunc.funcPtrWrap;

	return true;
}